

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2_cmac.cpp
# Opt level: O1

void ot::commissioner::otPbkdf2Cmac
               (uint8_t *aPassword,uint16_t aPasswordLen,uint8_t *aSalt,uint16_t aSaltLen,
               uint32_t aIterationCounter,uint16_t aKeyLen,uint8_t *aKey)

{
  ushort uVar1;
  uint32_t j;
  long lVar2;
  undefined6 in_register_0000000a;
  uint uVar3;
  ulong key_length;
  long keyBlock [2];
  long prfOne [2];
  uint8_t prfInput [34];
  long prfTwo [2];
  ushort local_c8;
  uint8_t *local_c0;
  ulong local_b8 [4];
  size_t local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uchar local_78 [48];
  ulong local_48 [3];
  
  local_88 = CONCAT62(in_register_0000000a,aSaltLen) & 0xffffffff;
  memcpy(local_78,aSalt,local_88);
  if ((aIterationCounter & 1) == 0) {
    if (aKeyLen != 0) {
      local_c0 = aKey;
      local_90 = (ulong)aSaltLen;
      key_length = (ulong)aPasswordLen;
      local_98 = (size_t)(aSaltLen + 4);
      local_80 = 0;
      local_c8 = aKeyLen;
      do {
        uVar3 = (int)local_80 + 1;
        local_80 = (ulong)uVar3;
        local_78[local_88] = (uchar)(uVar3 >> 0x18);
        local_78[local_90 + 1] = (uchar)(uVar3 >> 0x10);
        local_78[local_90 + 2] = (uchar)(uVar3 >> 8);
        local_78[local_90 + 3] = (uchar)uVar3;
        mbedtls_aes_cmac_prf_128(aPassword,key_length,local_78,local_98,(uchar *)local_b8);
        mbedtls_aes_cmac_prf_128
                  (aPassword,key_length,(uchar *)local_b8,0x10,(uchar *)(local_b8 + 2));
        lVar2 = 0;
        do {
          local_b8[lVar2] = local_b8[lVar2] ^ local_b8[lVar2 + 2];
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        if (2 < aIterationCounter) {
          uVar3 = 1;
          do {
            mbedtls_aes_cmac_prf_128
                      (aPassword,key_length,(uchar *)(local_b8 + 2),0x10,(uchar *)local_48);
            mbedtls_aes_cmac_prf_128
                      (aPassword,key_length,(uchar *)local_48,0x10,(uchar *)(local_b8 + 2));
            lVar2 = 0;
            do {
              local_b8[lVar2] = local_b8[lVar2] ^ local_48[lVar2] ^ local_b8[lVar2 + 2];
              lVar2 = lVar2 + 1;
            } while (lVar2 == 1);
            uVar3 = uVar3 + 1;
          } while (uVar3 != aIterationCounter >> 1);
        }
        uVar1 = 0x10;
        if (local_c8 < 0x10) {
          uVar1 = local_c8;
        }
        memcpy(local_c0,local_b8,(ulong)uVar1);
        local_c0 = local_c0 + uVar1;
        local_c8 = local_c8 - uVar1;
      } while (local_c8 != 0);
    }
    return;
  }
  __assert_fail("aIterationCounter % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/pbkdf2_cmac.cpp"
                ,0x44,
                "void ot::commissioner::otPbkdf2Cmac(const uint8_t *, uint16_t, const uint8_t *, uint16_t, uint32_t, uint16_t, uint8_t *)"
               );
}

Assistant:

void otPbkdf2Cmac(const uint8_t *aPassword,
                  uint16_t       aPasswordLen,
                  const uint8_t *aSalt,
                  uint16_t       aSaltLen,
                  uint32_t       aIterationCounter,
                  uint16_t       aKeyLen,
                  uint8_t       *aKey)
{
    const size_t kBlockSize = MBEDTLS_CIPHER_BLKSIZE_MAX;
    uint8_t      prfInput[OT_PBKDF2_SALT_MAX_LEN + 4]; // Salt || INT(), for U1 calculation
    long         prfOne[kBlockSize / sizeof(long)];
    long         prfTwo[kBlockSize / sizeof(long)];
    long         keyBlock[kBlockSize / sizeof(long)];
    uint32_t     blockCounter = 0;
    uint8_t     *key          = aKey;
    uint16_t     keyLen       = aKeyLen;
    uint16_t     useLen       = 0;

    memcpy(prfInput, aSalt, aSaltLen);
    assert(aIterationCounter % 2 == 0);
    aIterationCounter /= 2;

    while (keyLen)
    {
        ++blockCounter;
        prfInput[aSaltLen + 0] = static_cast<uint8_t>(blockCounter >> 24);
        prfInput[aSaltLen + 1] = static_cast<uint8_t>(blockCounter >> 16);
        prfInput[aSaltLen + 2] = static_cast<uint8_t>(blockCounter >> 8);
        prfInput[aSaltLen + 3] = static_cast<uint8_t>(blockCounter);

        // Calculate U_1
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, prfInput, aSaltLen + 4,
                                 reinterpret_cast<uint8_t *>(keyBlock));

        // Calculate U_2
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(keyBlock), kBlockSize,
                                 reinterpret_cast<uint8_t *>(prfOne));

        for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
        {
            keyBlock[j] ^= prfOne[j];
        }

        for (uint32_t i = 1; i < aIterationCounter; ++i)
        {
            // Calculate U_{2 * i - 1}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfOne), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfTwo));
            // Calculate U_{2 * i}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfTwo), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfOne));

            for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
            {
                keyBlock[j] ^= prfOne[j] ^ prfTwo[j];
            }
        }

        useLen = (keyLen < kBlockSize) ? keyLen : kBlockSize;
        memcpy(key, keyBlock, useLen);
        key += useLen;
        keyLen -= useLen;
    }
}